

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-store-buy.c
# Opt level: O1

_Bool borg_think_home_grab_useless(void)

{
  uint8_t *puVar1;
  int16_t *piVar2;
  byte bVar3;
  borg_item_conflict *pbVar4;
  wchar_t wVar5;
  int iVar6;
  int32_t iVar7;
  _Bool _Var8;
  ulong uVar9;
  bool bVar10;
  long lVar11;
  borg_item_conflict *item;
  int local_40;
  ulong local_38;
  
  wVar5 = borg_first_empty_inventory_slot();
  if ((wVar5 == L'\xffffffff') ||
     ((int)((uint)z_info->pack_size - borg.trait[0x9e]) <= wVar5 + L'\x01')) {
    _Var8 = false;
  }
  else {
    local_38 = 0;
    borg_notice_home((borg_item_conflict *)0x0,false);
    iVar6 = borg_power_home();
    if (z_info->store_inven_max == 0) {
      local_40 = -1;
    }
    else {
      local_40 = -1;
      uVar9 = 0;
      bVar10 = false;
      do {
        bVar3 = borg_shops[7].ware[uVar9].iqty;
        if (bVar3 != 0) {
          item = borg_shops[7].ware + uVar9;
          if (0 < (long)sold_item_num) {
            lVar11 = 0;
            do {
              if (((sold_item_tval[lVar11] == (uint)item->tval) &&
                  (sold_item_sval[lVar11] == (uint)item->sval)) && (sold_item_store[lVar11] == 7)) {
                bVar10 = true;
              }
              lVar11 = lVar11 + 1;
            } while (sold_item_num != lVar11);
          }
          if (!bVar10) {
            if ((item->tval & 0xfe) == 0x16) {
              local_38 = (long)(int)item->pval / (long)(int)(uint)bVar3 & 0xffffffff;
            }
            wVar5 = borg_min_item_quantity(item);
            pbVar4 = borg_shops[7].ware;
            puVar1 = &pbVar4[uVar9].iqty;
            *puVar1 = *puVar1 - (char)wVar5;
            if ((item->tval & 0xfe) == 0x16) {
              piVar2 = &pbVar4[uVar9].pval;
              *piVar2 = *piVar2 - (short)wVar5 * (short)local_38;
            }
            borg_notice_home((borg_item_conflict *)0x0,false);
            iVar7 = borg_power_home();
            memcpy(borg_shops[7].ware + uVar9,borg_safe_shops[7].ware + uVar9,0x388);
            if (iVar6 <= iVar7) {
              local_40 = (int)uVar9;
            }
            if (iVar6 < iVar7) {
              iVar6 = iVar7;
            }
          }
        }
        uVar9 = uVar9 + 1;
      } while (uVar9 < z_info->store_inven_max);
    }
    _Var8 = false;
    borg_notice_home((borg_item_conflict *)0x0,false);
    borg_power_home();
    if (-1 < local_40) {
      borg.goal.shop = 7;
      borg.goal.ware = (int16_t)local_40;
      _Var8 = true;
    }
  }
  return _Var8;
}

Assistant:

bool borg_think_home_grab_useless(void)
{
    int     p, n, b_n = -1;
    int32_t s, b_s = 0L;
    int     qty     = 1;
    int     charge_each = 0;
    bool    skip_it = false;
    int     hole    = borg_first_empty_inventory_slot();

    /* Require two empty slots */
    if (hole == -1)
        return false;
    if (hole + 1 >= PACK_SLOTS)
        return false;

    /* Examine the home */
    borg_notice_home(NULL, false);

    /* Evaluate the home */
    b_s = borg_power_home();

    /* Scan the home */
    for (n = 0; n < z_info->store_inven_max; n++) {
        borg_item *item = &borg_shops[BORG_HOME].ware[n];

        /* Skip empty items */
        if (!item->iqty)
            continue;

        /* skip stuff if we sold bought it */
        for (p = 0; p < sold_item_num; p++) {
            if (sold_item_tval[p] == item->tval
                && sold_item_sval[p] == item->sval
                && sold_item_store[p] == BORG_HOME)
                skip_it = true;
        }
        if (skip_it == true)
            continue;

        /* for wands and staffs adjust charges */
        if (item->tval == TV_STAFF || item->tval == TV_WAND)
            charge_each = item->pval / item->iqty;

        /* Save the number */
        qty = borg_min_item_quantity(item);

        /* Remove one item from shop */
        borg_shops[BORG_HOME].ware[n].iqty -= qty;

        /* for wands and staffs adjust charges */
        if (item->tval == TV_STAFF || item->tval == TV_WAND)
            borg_shops[BORG_HOME].ware[n].pval -= charge_each * qty;

        /* Examine the home */
        borg_notice_home(NULL, false);

        /* Evaluate the home */
        s = borg_power_home();

        /* Restore shop item */
        memcpy(&borg_shops[BORG_HOME].ware[n], &borg_safe_shops[BORG_HOME].ware[n],
            sizeof(borg_item));

        /* Ignore "bad" sales */
        if (s < b_s)
            continue;

        /* Maintain the "best" */
        b_n = n;
        b_s = s;
    }

    /* Examine the home */
    borg_notice_home(NULL, false);

    /* Evaluate the home */
    s = borg_power_home();

    /* Stockpile */
    if (b_n >= 0) {
        /* Visit the home */
        borg.goal.shop = BORG_HOME;

        /* Grab that item */
        borg.goal.ware = b_n;

        /* Success */
        return true;
    }

    /* Assume not */
    return false;
}